

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O3

void __thiscall Node::PrintTree(Node *this,string *Level,int Flag,char Node)

{
  long lVar1;
  VARTYPE VarType;
  ostream *poVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  int Flag_00;
  int loop;
  ulong uVar6;
  string NextLevel;
  string DownLevel;
  char local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (((this->Block[1] == (Node *)0x0 && this->Block[0] == (Node *)0x0) && (Flag == 0)) &&
     (this->Block[2] == (Node *)0x0)) {
    pcVar5 = "   ";
  }
  else {
    pcVar5 = " | ";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar5);
  std::operator+(&local_70,Level,&local_50);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(Level->_M_dataplus)._M_p,Level->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_71 = Node;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_71,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
  std::ostream::operator<<((ostream *)poVar2,this->Type);
  if ((this->TextValue)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Text: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(this->TextValue)._M_dataplus._M_p,
               (this->TextValue)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <",2);
  VarType = GetNodeVarType(this);
  pcVar5 = DumpVarType(VarType);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13e1b0);
  }
  else {
    sVar3 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  uVar6 = 0;
  do {
    if (this->Tree[uVar6] != (Node *)0x0) {
      Flag_00 = 0;
      if (uVar6 < 4) {
        Flag_00 = 0;
        uVar4 = uVar6;
        do {
          lVar1 = uVar4 + 1;
          uVar4 = uVar4 + 1;
          if (this->Tree[lVar1] != (Node *)0x0) {
            Flag_00 = 1;
          }
        } while (uVar4 != 4);
      }
      PrintTree(this->Tree[uVar6],&local_70,Flag_00,(byte)uVar6 | 0x30);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 5);
  if (this->Block[1] != (Node *)0x0) {
    PrintTree(this->Block[1],&local_70,0,'T');
  }
  if (this->Block[2] != (Node *)0x0) {
    PrintTree(this->Block[2],&local_70,0,'E');
  }
  if (this->Block[0] != (Node *)0x0) {
    PrintTree(this->Block[0],Level,0,'D');
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Node::PrintTree(
	const std::string &Level,	/**< Current indent level */
	int Flag,			/**< Output Flags */
	char Node			/**< Character to link to indent level */
)
{
	//
	// Local variables
	//
	std::string DownLevel;

	//
	// Make sure we have an active node
	//
	if ((Block[0] != 0) || (Block[1] != 0) ||
		(Block[2] != 0) || Flag)
	{
		DownLevel = " | ";
	}
	else
	{
		DownLevel = "   ";
	}

	std::string NextLevel = Level + DownLevel;

	//
	// Print bars for this level
	//
	std::cout << Level << " " << Node << "-" << Type;

	if (TextValue.length() != 0)
	{
		std::cout << " Text: " << TextValue;
	}

	//
	// Output variable type
	//
	std::cout << " <" << DumpVarType(GetNodeVarType()) << ">";

	std::cout << std::endl;

	//
	// Print Parameter Levels
	//
	for (int loop = 0; loop < 5; loop++)
	{
		if (Tree[loop] != 0)
		{
			int fflag = 0;
			for (int inloop = loop + 1; inloop < 5; inloop++)
			{
				if (Tree[inloop] != 0)
				{
					fflag = 1;
				}
			}
			Tree[loop]->PrintTree(NextLevel, fflag, loop + '0');
		}
	}

	//
	// Link down to next parent if possible
	//
	if (Block[1] != 0)
	{
		Block[1]->PrintTree(NextLevel, 0, 'T');
	}
	if (Block[2] != 0)
	{
		Block[2]->PrintTree(NextLevel, 0, 'E');
	}
	if (Block[0] != 0)
	{
		Block[0]->PrintTree(Level, 0, 'D');
	}
}